

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O0

void __thiscall boost::thread_group::thread_group(thread_group *this)

{
  shared_mutex *unaff_retaddr;
  
  std::__cxx11::list<boost::thread_*,_std::allocator<boost::thread_*>_>::list
            ((list<boost::thread_*,_std::allocator<boost::thread_*>_> *)0x29dc48);
  shared_mutex::shared_mutex(unaff_retaddr);
  return;
}

Assistant:

thread_group() {}